

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eclmap.c
# Opt level: O0

void eclmap_load(uint version,eclmap_t *emap,FILE *f,char *fn)

{
  undefined1 local_48 [8];
  state_t state;
  char *fn_local;
  FILE *f_local;
  eclmap_t *emap_local;
  uint version_local;
  
  local_48 = (undefined1  [8])emap;
  state._16_8_ = fn;
  state.fn = fn;
  control((state_t *)local_48,0,"!ins_names");
  seqmap_load("!eclmap",local_48,set,control,f,state.fn);
  return;
}

Assistant:

void
eclmap_load(
    unsigned int version,
    eclmap_t* emap,
    FILE* f,
    const char* fn)
{
    (void)version;
    state_t state;
    state.emap = emap;
    state.fn = fn;
    control(&state, 0, "!ins_names"); // default section
    seqmap_load("!eclmap", &state, (seqmap_setfunc_t)set, (seqmap_controlfunc_t)control, f, fn);
}